

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::
BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setValue(BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,string *arg)

{
  string *in_RSI;
  ParserResult *in_RDI;
  
  convertInto((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

ParserResult setValue( std::string const& arg ) override {
                    return convertInto( arg, m_ref );
                }